

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaSlCrank_dns.c
# Opt level: O0

int main(void)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  N_Vector yy_00;
  N_Vector yp_00;
  UserData data_00;
  void *mem_00;
  SUNContext ctx;
  SUNLinearSolver LS;
  SUNMatrix A;
  int iout;
  int retval;
  sunrealtype tret;
  sunrealtype dt;
  sunrealtype tout;
  sunrealtype tf;
  sunrealtype t0;
  sunrealtype atol;
  sunrealtype rtol;
  N_Vector id;
  N_Vector yp;
  N_Vector yy;
  void *mem;
  UserData data;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  char *pcVar4;
  void *pvVar5;
  undefined4 in_stack_ffffffffffffff90;
  sunrealtype in_stack_ffffffffffffff98;
  void *mem_01;
  undefined8 local_18;
  undefined8 *local_10;
  int local_4;
  
  local_4 = 0;
  pvVar5 = (void *)0x0;
  pcVar4 = (char *)0x0;
  SUNContext_Create(0,&stack0xffffffffffffff78);
  iVar1 = check_retval(pvVar5,pcVar4,in_stack_ffffffffffffff7c);
  if (iVar1 == 0) {
    local_10 = (undefined8 *)malloc(0x40);
    *local_10 = 0x3fe0000000000000;
    local_10[1] = 0x3ff0000000000000;
    local_10[3] = 0x3ff0000000000000;
    local_10[2] = 0x4000000000000000;
    local_10[4] = 0x3ff0000000000000;
    local_10[5] = 0x3ff0000000000000;
    local_10[6] = 0x3ff0000000000000;
    local_10[7] = 0x3ff0000000000000;
    yy_00 = (N_Vector)
            N_VNew_Serial(10,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    yp_00 = (N_Vector)N_VClone(yy_00);
    data_00 = (UserData)N_VClone(yy_00);
    setIC(yy_00,yp_00,data_00);
    N_VConst(0x3ff0000000000000,data_00);
    *(undefined8 *)(*(long *)((long)data_00->a + 0x10) + 0x30) = 0;
    *(undefined8 *)(*(long *)((long)data_00->a + 0x10) + 0x38) = 0;
    *(undefined8 *)(*(long *)((long)data_00->a + 0x10) + 0x40) = 0;
    *(undefined8 *)(*(long *)((long)data_00->a + 0x10) + 0x48) = 0;
    mem_01 = (void *)0x3eb0c6f7a0b5ed8d;
    mem_00 = (void *)0x3fd0000000000000;
    local_18 = IDACreate(CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    IDAInit(0,local_18,ressc,yy_00,yp_00);
    IDASStolerances(0x3eb0c6f7a0b5ed8d,mem_01,local_18);
    IDASetUserData(local_18,local_10);
    IDASetId(local_18,data_00);
    IDASetSuppressAlg(local_18,1);
    pvVar5 = (void *)SUNDenseMatrix(10,10,CONCAT44(in_stack_ffffffffffffff7c,
                                                   in_stack_ffffffffffffff78));
    iVar1 = check_retval(pvVar5,pcVar4,in_stack_ffffffffffffff7c);
    if (iVar1 == 0) {
      pcVar4 = (char *)SUNLinSol_Dense(yy_00,pvVar5,
                                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                                      );
      iVar1 = check_retval(pvVar5,pcVar4,in_stack_ffffffffffffff7c);
      if (iVar1 == 0) {
        uVar2 = IDASetLinearSolver(local_18,pcVar4,pvVar5);
        iVar1 = check_retval(pvVar5,pcVar4,in_stack_ffffffffffffff7c);
        if (iVar1 == 0) {
          PrintHeader((sunrealtype)pcVar4,
                      (sunrealtype)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                      (N_Vector)0x1026f0);
          PrintOutput(mem_00,in_stack_ffffffffffffff98,
                      (N_Vector)CONCAT44(uVar2,in_stack_ffffffffffffff90));
          iVar1 = 1;
          while ((iVar1 < 0x29 &&
                 (iVar3 = IDASolve((double)iVar1 * (double)mem_00,local_18,&stack0xffffffffffffff98,
                                   yy_00,yp_00,1), -1 < iVar3))) {
            PrintOutput(mem_00,in_stack_ffffffffffffff98,(N_Vector)CONCAT44(iVar3,iVar1));
            iVar1 = iVar1 + 1;
          }
          PrintFinalStats(mem_01);
          free(local_10);
          IDAFree(&local_18);
          SUNLinSolFree(pcVar4);
          SUNMatDestroy(pvVar5);
          N_VDestroy(yy_00);
          N_VDestroy(yp_00);
          N_VDestroy(data_00);
          SUNContext_Free(&stack0xffffffffffffff78);
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  UserData data;

  void* mem;
  N_Vector yy, yp, id;
  sunrealtype rtol, atol;
  sunrealtype t0, tf, tout, dt, tret;
  int retval, iout;
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext ctx;

  A  = NULL;
  LS = NULL;

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* User data */

  data = (UserData)malloc(sizeof *data);

  data->a  = 0.5; /* half-length of crank */
  data->J1 = 1.0; /* crank moment of inertia */
  data->m2 = 1.0; /* mass of connecting rod */
  data->J2 = 2.0; /* moment of inertia of connecting rod */
  data->k  = 1.0; /* spring constant */
  data->c  = 1.0; /* damper constant */
  data->l0 = 1.0; /* spring free length */
  data->F  = 1.0; /* external constant force */

  /* Create N_Vectors */
  yy = N_VNew_Serial(NEQ, ctx);
  yp = N_VClone(yy);
  id = N_VClone(yy);

  /* Consistent IC */
  setIC(yy, yp, data);

  /* ID array */
  N_VConst(ONE, id);
  NV_Ith_S(id, 6) = ZERO;
  NV_Ith_S(id, 7) = ZERO;
  NV_Ith_S(id, 8) = ZERO;
  NV_Ith_S(id, 9) = ZERO;

  /* Tolerances */
  rtol = SUN_RCONST(1.0e-6);
  atol = SUN_RCONST(1.0e-6);

  /* Integration limits */
  t0 = ZERO;
  tf = TEND;
  dt = (tf - t0) / (NOUT - 1);

  /* IDA initialization */
  mem    = IDACreate(ctx);
  retval = IDAInit(mem, ressc, t0, yy, yp);
  retval = IDASStolerances(mem, rtol, atol);
  retval = IDASetUserData(mem, data);
  retval = IDASetId(mem, id);
  retval = IDASetSuppressAlg(mem, SUNTRUE);

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  PrintHeader(rtol, atol, yy);

  /* In loop, call IDASolve, print results, and test for error. */

  retval = PrintOutput(mem, t0, yy);

  tout = dt;
  for (iout = 1; iout < NOUT; iout++)
  {
    tout   = iout * dt;
    retval = IDASolve(mem, tout, &tret, yy, yp, IDA_NORMAL);
    if (retval < 0) { break; }

    retval = PrintOutput(mem, tret, yy);
  }

  retval = PrintFinalStats(mem);

  /* Free memory */

  free(data);
  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(id);
  SUNContext_Free(&ctx);

  return (0);
}